

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

TypeBase * anon_unknown.dwarf_6f1cc::LookupTypeByName(ExpressionContext *ctx,uint nameHash)

{
  TypeBase *node;
  TypeLookupResult *pTVar1;
  TypeClass *pTVar2;
  TypeGenericClassProto *pTVar3;
  TypeGenericClassProto *exact_1;
  TypeClass *exact;
  SynBase *typeLocation;
  TypeBase *type;
  TypeLookupResult *lookup;
  ScopeData *scope;
  uint nameHash_local;
  ExpressionContext *ctx_local;
  
  lookup = (TypeLookupResult *)ctx->scope;
  while( true ) {
    while( true ) {
      while( true ) {
        if (lookup == (TypeLookupResult *)0x0) {
          return (TypeBase *)0x0;
        }
        pTVar1 = DirectChainedMap<TypeLookupResult>::find
                           ((DirectChainedMap<TypeLookupResult> *)&lookup[0x13].alias,nameHash);
        if (pTVar1 != (TypeLookupResult *)0x0) break;
        lookup = (TypeLookupResult *)lookup->type;
      }
      node = pTVar1->type;
      if (node != (TypeBase *)0x0) break;
      if (((ctx->lookupLocation == (SynBase *)0x0) || (((ulong)lookup[0x15].type & 1) != 0)) ||
         ((pTVar1->alias->importModule != (ModuleData *)0x0 ||
          ((pTVar1->alias->source->pos).begin <= (ctx->lookupLocation->pos).begin)))) {
        return pTVar1->alias->type;
      }
      lookup = (TypeLookupResult *)lookup->type;
    }
    if (((ctx->lookupLocation == (SynBase *)0x0) || (((ulong)lookup[0x15].type & 1) != 0)) ||
       (node->importModule != (ModuleData *)0x0)) break;
    exact = (TypeClass *)0x0;
    pTVar2 = getType<TypeClass>(node);
    if (pTVar2 == (TypeClass *)0x0) {
      pTVar3 = getType<TypeGenericClassProto>(node);
      if (pTVar3 != (TypeGenericClassProto *)0x0) {
        exact = (TypeClass *)pTVar3->definition;
      }
    }
    else {
      exact = (TypeClass *)pTVar2->source;
    }
    if ((exact == (TypeClass *)0x0) ||
       ((exact->super_TypeStruct).super_TypeBase.importModule <=
        (ModuleData *)(ctx->lookupLocation->pos).begin)) break;
    lookup = (TypeLookupResult *)lookup->type;
  }
  return pTVar1->type;
}

Assistant:

TypeBase* LookupTypeByName(ExpressionContext &ctx, unsigned nameHash)
	{
		ScopeData *scope = ctx.scope;

		while(scope)
		{
			if(TypeLookupResult *lookup = scope->typeLookupMap.find(nameHash))
			{
				if(TypeBase *type = lookup->type)
				{
					// Check type visibility
					if(ctx.lookupLocation && !scope->unrestricted && !type->importModule)
					{
						SynBase *typeLocation = NULL;

						if(TypeClass *exact = getType<TypeClass>(type))
							typeLocation = exact->source;
						else if(TypeGenericClassProto *exact = getType<TypeGenericClassProto>(type))
							typeLocation = exact->definition;

						if(typeLocation && typeLocation->pos.begin > ctx.lookupLocation->pos.begin)
						{
							scope = scope->scope;
							continue;
						}
					}

					return lookup->type;
				}

				// Check alias visibility
				if(ctx.lookupLocation && !scope->unrestricted && !lookup->alias->importModule)
				{
					if(lookup->alias->source->pos.begin > ctx.lookupLocation->pos.begin)
					{
						scope = scope->scope;
						continue;
					}
				}

				return lookup->alias->type;
			}

			scope = scope->scope;
		}

		return NULL;
	}